

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * DecodeBase64(string *_encoded)

{
  uint uVar1;
  char *pcVar2;
  char *bufcoded;
  ulong uVar3;
  string *in_RDI;
  int len;
  char *buf;
  string *ret;
  allocator local_1e;
  undefined1 local_1d;
  int local_1c;
  char *local_18;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  uVar1 = Base64decode_len(pcVar2);
  pcVar2 = (char *)operator_new__((ulong)uVar1);
  local_18 = pcVar2;
  bufcoded = (char *)std::__cxx11::string::c_str();
  local_1c = Base64decode(pcVar2,bufcoded);
  pcVar2 = local_18;
  local_1d = 0;
  uVar3 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar2,uVar3,&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  if (local_18 != (char *)0x0) {
    operator_delete__(local_18);
  }
  return in_RDI;
}

Assistant:

std::string DecodeBase64 (const std::string& _encoded)
{
    // create a buffer for the result and do the decoding
    char* buf = new char [(unsigned)Base64decode_len(_encoded.c_str())];
    const int len = Base64decode(buf, _encoded.c_str());
    std::string ret (buf, (size_t)len);
    delete [] buf;
    return ret;
}